

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_empty_Test::~test_matrix_sparse_empty_Test(test_matrix_sparse_empty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, empty) {
  Matrix_Sparse matrix;
  EXPECT_TRUE(matrix.empty());
  EXPECT_EQ(matrix.size_row(), 0);
  EXPECT_EQ(matrix.size_column(), 0);
  EXPECT_EQ(matrix.size_non_zero(), 0);
  EXPECT_EQ(matrix.size().first, std::make_pair(0, 0).first);
  EXPECT_EQ(matrix.size().second, std::make_pair(0, 0).second);

  // check edge cases.
  matrix.resize(0, 2);
  EXPECT_TRUE(matrix.empty());
  matrix.resize(1, 0);
  EXPECT_FALSE(matrix.empty());
  matrix.resize(2, 2);
  EXPECT_FALSE(matrix.empty());
}